

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Stress::LongShaderTests::init(LongShaderTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  double dVar2;
  uint uVar3;
  size_type sVar4;
  deUint32 dVar5;
  long *plVar6;
  undefined8 *puVar7;
  TestNode *node;
  undefined4 *puVar8;
  long *plVar9;
  ulong *puVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  string desc;
  string name;
  ShaderType local_2bc;
  long *local_2b8;
  undefined8 local_2b0;
  long local_2a8;
  undefined8 uStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  ulong local_278;
  uint local_26c;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  double local_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  ulong local_1c0;
  TestNode *local_1b8;
  double local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = 0;
  local_1b8 = (TestNode *)this;
  do {
    local_278 = (ulong)(uint)(&DAT_00b67090)[local_1c0];
    local_26c = (uint)(local_1c0 < 2);
    local_228 = (double)local_278;
    local_1b0 = SQRT(local_228);
    local_2bc = SHADERTYPE_VERTEX;
    do {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_288 = *plVar9;
        lStack_280 = plVar6[3];
        local_298 = &local_288;
      }
      else {
        local_288 = *plVar9;
        local_298 = (long *)*plVar6;
      }
      local_290 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getShaderTypeName(local_2bc);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_1d0 = *plVar9;
        lStack_1c8 = plVar6[3];
        local_1e0 = &local_1d0;
      }
      else {
        local_1d0 = *plVar9;
        local_1e0 = (long *)*plVar6;
      }
      local_1d8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      local_200[0] = local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Compile ","");
      glu::getShaderTypeName(local_2bc);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_200);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_210 = *plVar9;
        lStack_208 = plVar6[3];
        local_220 = &local_210;
      }
      else {
        local_210 = *plVar9;
        local_220 = (long *)*plVar6;
      }
      local_218 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_258 = *puVar10;
        lStack_250 = plVar6[3];
        local_268 = &local_258;
      }
      else {
        local_258 = *puVar10;
        local_268 = (ulong *)*plVar6;
      }
      local_260 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar12 = 0xf;
      if (local_268 != &local_258) {
        uVar12 = local_258;
      }
      if (uVar12 < (ulong)(local_240 + local_260)) {
        uVar12 = 0xf;
        if (local_248 != local_238) {
          uVar12 = local_238[0];
        }
        if (uVar12 < (ulong)(local_240 + local_260)) goto LAB_007a2930;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_268);
      }
      else {
LAB_007a2930:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_248);
      }
      local_2b8 = &local_2a8;
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_2a8 = *plVar6;
        uStack_2a0 = puVar7[3];
      }
      else {
        local_2a8 = *plVar6;
        local_2b8 = (long *)*puVar7;
      }
      local_2b0 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_288 = *plVar9;
        lStack_280 = plVar6[3];
        local_298 = &local_288;
      }
      else {
        local_288 = *plVar9;
        local_298 = (long *)*plVar6;
      }
      local_290 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      if (local_220 != &local_210) {
        operator_delete(local_220,local_210 + 1);
      }
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      uVar13 = SUB84(local_1b0,0);
      uVar14 = (undefined4)((ulong)local_1b0 >> 0x20);
      if (local_228 < 0.0) {
        dVar2 = sqrt(local_228);
        uVar13 = SUB84(dVar2,0);
        uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      dVar2 = floor((double)CONCAT44(uVar14,uVar13));
      uVar11 = (uint)(long)dVar2;
      if (uVar11 < 0xb) {
        uVar11 = 10;
      }
      uVar3 = uVar11 >> 1;
      if (9 < uVar11 >> 1) {
        uVar3 = 10;
      }
      node = (TestNode *)operator_new(0x120);
      plVar6 = local_1e0;
      pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)node,pCVar1->m_testCtx,(char *)local_1e0,(char *)local_298);
      node[1]._vptr_TestNode = (_func_int **)pCVar1;
      node->_vptr_TestNode = (_func_int **)&PTR__LongShaderCompileStressCase_00d41440;
      *(ShaderType *)&node[1].m_testCtx = local_2bc;
      *(uint *)((long)&node[1].m_testCtx + 4) = local_26c;
      dVar5 = deStringHash((char *)plVar6);
      deRandom_init((deRandom *)&node[1].m_name,dVar5 ^ 0xac9c91d);
      sVar4 = node[1].m_name._M_string_length;
      node[1].m_name.field_2._M_allocated_capacity = (size_type)node[1].m_name._M_dataplus._M_p;
      *(size_type *)((long)&node[1].m_name.field_2 + 8) = sVar4;
      *(ShaderType *)&node[1].m_description._M_dataplus._M_p = local_2bc;
      *(int *)((long)&node[1].m_description._M_dataplus._M_p + 4) = (int)local_278;
      *(uint *)&node[1].m_description._M_string_length = uVar11;
      *(uint *)((long)&node[1].m_description._M_string_length + 4) = uVar3;
      node[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&node[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&node[1].m_nodeType = 0;
      puVar8 = (undefined4 *)operator_new(4);
      this = (LongShaderTests *)local_1b8;
      *(undefined4 **)&node[1].m_description.field_2 = puVar8;
      *(undefined4 **)((long)&node[1].m_description.field_2 + 8) = puVar8;
      *(undefined4 **)&node[1].m_nodeType = puVar8 + 1;
      *puVar8 = 0;
      *(undefined4 **)((long)&node[1].m_description.field_2 + 8) = puVar8 + 1;
      *(undefined4 *)
       &node[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = 1;
      *(undefined8 *)
       ((long)&node[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&node[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&node[1].m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&node[2]._vptr_TestNode + 4) = 0;
      *(undefined8 *)((long)&node[2].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&node[2].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined4 *)((long)&node[2].m_name._M_string_length + 4) = 0;
      node[2].m_name.field_2._M_allocated_capacity = (size_type)&node[2].m_description;
      *(undefined8 *)((long)&node[2].m_name.field_2 + 8) = 0;
      *(undefined1 *)&node[2].m_description._M_dataplus._M_p = 0;
      tcu::TestNode::addChild(local_1b8,node);
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0,local_1d0 + 1);
      }
      local_2bc = local_2bc + SHADERTYPE_FRAGMENT;
    } while (local_2bc == SHADERTYPE_FRAGMENT);
    local_1c0 = local_1c0 + 1;
    if (local_1c0 == 4) {
      return local_2bc;
    }
  } while( true );
}

Assistant:

void LongShaderTests::init (void)
{
	const deUint32	requireLinkOkMaxOps	= 1000;

	const deUint32	caseOpCounts[] =
	{
		100,
		1000,
		10000,
		100000
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(caseOpCounts); caseNdx++)
	{
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType		= (shaderTypeInt == 0) ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT;
			const deUint32			opCount			= caseOpCounts[caseNdx];
			const deUint32			flags			= (opCount <= requireLinkOkMaxOps) ? CASE_REQUIRE_LINK_STATUS_OK : 0;

			const std::string		name			= de::toString(opCount) + "_operations_" + glu::getShaderTypeName(shaderType);
			const std::string		desc			= std::string("Compile ") + glu::getShaderTypeName(shaderType) + " shader with " + de::toString(opCount) + " operations";

			LongShaderSpec			caseSpec		(shaderType, opCount);

			addChild(new LongShaderCompileStressCase(m_context, name.c_str(), desc.c_str(), caseSpec, flags));
		}
	}
}